

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position_third_step1.cpp
# Opt level: O2

void __thiscall
ruckig::PositionThirdOrderStep1::time_none_two_step
          (PositionThirdOrderStep1 *this,ProfileIter *profile,double vMax,double vMin,double aMax,
          double aMin,double jMax)

{
  Profile *pPVar1;
  double dVar2;
  bool bVar3;
  
  dVar2 = (this->vf - this->v0) * jMax + (this->a0_a0 + this->af_af) * 0.5;
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  dVar2 = (ABS(jMax) * dVar2) / jMax;
  pPVar1 = *profile;
  (pPVar1->t)._M_elems[0] = (dVar2 - this->a0) / jMax;
  (pPVar1->t)._M_elems[1] = 0.0;
  (pPVar1->t)._M_elems[2] = (dVar2 - this->af) / jMax;
  (pPVar1->t)._M_elems[3] = 0.0;
  (pPVar1->t)._M_elems[4] = 0.0;
  (pPVar1->t)._M_elems[5] = 0.0;
  (pPVar1->t)._M_elems[6] = 0.0;
  bVar3 = Profile::check<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7,false>
                    (pPVar1,jMax,vMax,vMin,aMax,aMin);
  if (!bVar3) {
    pPVar1 = *profile;
    (pPVar1->t)._M_elems[0] = (this->af - this->a0) / jMax;
    (pPVar1->t)._M_elems[1] = 0.0;
    (pPVar1->t)._M_elems[2] = 0.0;
    (pPVar1->t)._M_elems[3] = 0.0;
    (pPVar1->t)._M_elems[4] = 0.0;
    (pPVar1->t)._M_elems[5] = 0.0;
    (pPVar1->t)._M_elems[6] = 0.0;
    bVar3 = Profile::check<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7,false>
                      (pPVar1,jMax,vMax,vMin,aMax,aMin);
    if (!bVar3) {
      return;
    }
  }
  add_profile(this,profile);
  return;
}

Assistant:

void PositionThirdOrderStep1::time_none_two_step(ProfileIter& profile, double vMax, double vMin, double aMax, double aMin, double jMax) const {
    // Two step
    {
        const double h0 = std::sqrt((a0_a0 + af_af)/2 + jMax*(vf - v0)) * std::abs(jMax) / jMax;
        profile->t[0] = (h0 - a0)/jMax;
        profile->t[1] = 0;
        profile->t[2] = (h0 - af)/jMax;
        profile->t[3] = 0;
        profile->t[4] = 0;
        profile->t[5] = 0;
        profile->t[6] = 0;

        if (profile->check<ControlSigns::UDDU, ReachedLimits::NONE>(jMax, vMax, vMin, aMax, aMin)) {
            add_profile(profile);
            return;
        }
    }

    // Single step
    {
        profile->t[0] = (af - a0)/jMax;
        profile->t[1] = 0;
        profile->t[2] = 0;
        profile->t[3] = 0;
        profile->t[4] = 0;
        profile->t[5] = 0;
        profile->t[6] = 0;

        if (profile->check<ControlSigns::UDDU, ReachedLimits::NONE>(jMax, vMax, vMin, aMax, aMin)) {
            add_profile(profile);
            return;
        }
    }
}